

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VLinearCombinationVectorArray(N_Vector V,sunindextype local_length,int myid)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  uint in_EDX;
  N_Vector in_RDI;
  double dVar4;
  double dVar5;
  N_Vector *X [3];
  N_Vector *Z;
  sunrealtype c [3];
  double maxt;
  double stop_time;
  double start_time;
  int ierr;
  int failure;
  int fails;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  N_Vector p_Var6;
  sunrealtype in_stack_ffffffffffffffb0;
  sunrealtype sVar7;
  int local_1c;
  int local_18;
  
  local_18 = 0;
  puVar3 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  local_78 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  local_70 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  local_68 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  N_VConst(0x3fe0000000000000,*local_78);
  p_Var6 = (N_Vector)&DAT_4000000000000000;
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(1,1,&stack0xffffffffffffffa8,&local_78,local_78);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(in_stack_ffffffffffffffb0,p_Var6,(sunindextype)puVar3);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 1a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 1a, Proc %d \n",(ulong)in_EDX);
    local_18 = 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VConst(0x3fe0000000000000,*local_78);
  N_VConst(0,*puVar3);
  p_Var6 = (N_Vector)&DAT_4000000000000000;
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(1,1,&stack0xffffffffffffffa8,&local_78,puVar3);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(in_stack_ffffffffffffffb0,p_Var6,(sunindextype)puVar3);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 1b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 1b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VConst(0x3fe0000000000000,*local_78);
  N_VConst(0xbff0000000000000,*local_70);
  p_Var6 = (N_Vector)&DAT_4000000000000000;
  sVar7 = -1.0;
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(1,2,&stack0xffffffffffffffa8,&local_78,local_78);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 2a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 2a, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VConst(0x3fe0000000000000,*local_78);
  N_VConst(0xbff0000000000000,*local_70);
  p_Var6 = (N_Vector)&DAT_4000000000000000;
  sVar7 = -1.0;
  N_VConst(0,*puVar3);
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(1,2,&stack0xffffffffffffffa8,&local_78,puVar3);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 2b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 2b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VConst(0x3ff0000000000000,*local_78);
  N_VConst(0xc000000000000000,*local_70);
  N_VConst(0xbff0000000000000,*local_68);
  p_Var6 = (N_Vector)&DAT_4000000000000000;
  sVar7 = 0.5;
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(1,3,&stack0xffffffffffffffa8,&local_78,local_78);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 3a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 3a, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VConst(0x3ff0000000000000,*local_78);
  N_VConst(0xc000000000000000,*local_70);
  N_VConst(0xbff0000000000000,*local_68);
  p_Var6 = (N_Vector)&DAT_4000000000000000;
  sVar7 = 0.5;
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(1,3,&stack0xffffffffffffffa8,&local_78,puVar3);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 3b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 3b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VConst(0xc000000000000000,*local_78);
  N_VConst(0xbff0000000000000,local_78[1]);
  N_VConst(0x4000000000000000,local_78[2]);
  p_Var6 = (N_Vector)&DAT_3fe0000000000000;
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(3,1,&stack0xffffffffffffffa8,&local_78,local_78);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    iVar2 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 4a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 4a, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VConst(0xc000000000000000,*local_78);
  N_VConst(0xbff0000000000000,local_78[1]);
  N_VConst(0x4000000000000000,local_78[2]);
  p_Var6 = (N_Vector)&DAT_3fe0000000000000;
  N_VConst(0,*puVar3);
  N_VConst(0,puVar3[1]);
  N_VConst(0,puVar3[2]);
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(3,1,&stack0xffffffffffffffa8,&local_78,puVar3);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    iVar2 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 4b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 4b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VConst(0xc000000000000000,*local_78);
  N_VConst(0x4000000000000000,*local_70);
  N_VConst(0x4000000000000000,local_78[1]);
  N_VConst(0x3fe0000000000000,local_70[1]);
  N_VConst(0,local_78[2]);
  N_VConst(0x3fe0000000000000,local_70[2]);
  p_Var6 = (N_Vector)&DAT_3fe0000000000000;
  sVar7 = 2.0;
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(3,2,&stack0xffffffffffffffa8,&local_78,local_78);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    iVar2 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 5a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 5a, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VConst(0xc000000000000000,*local_78);
  N_VConst(0x4000000000000000,*local_70);
  N_VConst(0x4000000000000000,local_78[1]);
  N_VConst(0x3fe0000000000000,local_70[1]);
  N_VConst(0,local_78[2]);
  N_VConst(0x3fe0000000000000,local_70[2]);
  p_Var6 = (N_Vector)&DAT_3fe0000000000000;
  sVar7 = 2.0;
  N_VConst(0,*puVar3);
  N_VConst(0,puVar3[1]);
  N_VConst(0,puVar3[2]);
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(3,2,&stack0xffffffffffffffa8,&local_78,puVar3);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    iVar2 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 5b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 5b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VConst(0x4000000000000000,*local_78);
  N_VConst(0xc000000000000000,*local_70);
  N_VConst(0xbff0000000000000,*local_68);
  N_VConst(0x3ff0000000000000,local_78[1]);
  N_VConst(0x4000000000000000,local_70[1]);
  N_VConst(0x3ff0000000000000,local_68[1]);
  N_VConst(0xbff0000000000000,local_78[2]);
  N_VConst(0x4000000000000000,local_70[2]);
  N_VConst(0x4000000000000000,local_68[2]);
  p_Var6 = (N_Vector)&DAT_3ff0000000000000;
  sVar7 = -0.5;
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(3,3,&stack0xffffffffffffffa8,&local_78,local_78);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    iVar2 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 6a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 6a, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VConst(0x3ff0000000000000,*local_78);
  N_VConst(0xc000000000000000,*local_70);
  N_VConst(0xbff0000000000000,*local_68);
  N_VConst(0xbff0000000000000,local_78[1]);
  N_VConst(0x4000000000000000,local_70[1]);
  N_VConst(0x3ff0000000000000,local_68[1]);
  N_VConst(0x3fe0000000000000,local_78[2]);
  N_VConst(0x4000000000000000,local_70[2]);
  N_VConst(0x3ff0000000000000,local_68[2]);
  p_Var6 = (N_Vector)&DAT_4000000000000000;
  sVar7 = 0.5;
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(3,3,&stack0xffffffffffffffa8,&local_78,local_78);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    iVar2 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 6b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 6b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VConst(0x3ff0000000000000,*local_78);
  N_VConst(0xc000000000000000,*local_70);
  N_VConst(0xbff0000000000000,*local_68);
  N_VConst(0xbff0000000000000,local_78[1]);
  N_VConst(0x4000000000000000,local_70[1]);
  N_VConst(0x3ff0000000000000,local_68[1]);
  N_VConst(0x3fe0000000000000,local_78[2]);
  N_VConst(0x4000000000000000,local_70[2]);
  N_VConst(0x3ff0000000000000,local_68[2]);
  p_Var6 = (N_Vector)&DAT_4000000000000000;
  sVar7 = 0.5;
  N_VConst(0,*puVar3);
  N_VConst(0,puVar3[1]);
  N_VConst(0,puVar3[2]);
  dVar4 = get_time();
  iVar1 = N_VLinearCombinationVectorArray(3,3,&stack0xffffffffffffffa8,&local_78,puVar3);
  sync_device(in_RDI);
  dVar5 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    iVar2 = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = check_ans(sVar7,p_Var6,(sunindextype)puVar3);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VLinearCombinationVectorArray Case 6c \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 6c, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar4 = max_time(in_RDI,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar4,"N_VLinearCombinationVectorArray");
  }
  N_VDestroyVectorArray(puVar3,3);
  N_VDestroyVectorArray(local_78,3);
  N_VDestroyVectorArray(local_70,3);
  N_VDestroyVectorArray(local_68,3);
  return local_18;
}

Assistant:

int Test_N_VLinearCombinationVectorArray(N_Vector V, sunindextype local_length,
                                         int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  sunrealtype c[3];
  N_Vector* Z;
  N_Vector* X[3];

  /* create vectors for testing */
  Z = N_VCloneVectorArray(3, V);

  X[0] = N_VCloneVectorArray(3, V);
  X[1] = N_VCloneVectorArray(3, V);
  X[2] = N_VCloneVectorArray(3, V);

  /*
   * Case 1a: (nvec = 1, nsum = 1), N_VScale
   * X[0][0] = c[0] X[0][0]
   */

  /* fill vector data and scaling factor */
  N_VConst(HALF, X[0][0]);
  c[0] = TWO;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(1, 1, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][0] should equal +1 */
  if (ierr == 0) { failure = check_ans(ONE, X[0][0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 1a, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 1a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 1b: (nvec = 1, nsum = 1), N_VScale
   * Z[0] = c[0] X[0][0]
   */

  /* fill vector data and scaling factor */
  N_VConst(HALF, X[0][0]);
  N_VConst(ZERO, Z[0]);
  c[0] = TWO;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(1, 1, c, X, Z);
  sync_device(V);
  stop_time = get_time();

  /* X[0][0] should equal +1 */
  if (ierr == 0) { failure = check_ans(ONE, Z[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 1b, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 1b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 2a: (nvec = 1, nsum = 2), N_VLinearSum
   * X[0][0] = c[0] X[0][0] + c[1] X[1][0]
   */

  /* fill vector data and scaling factor */
  N_VConst(HALF, X[0][0]);
  N_VConst(NEG_ONE, X[1][0]);

  c[0] = TWO;
  c[1] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(1, 2, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][0] should equal +2 */
  if (ierr == 0) { failure = check_ans(TWO, X[0][0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 2a, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 2a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 2b: (nvec = 1, nsum = 2), N_VLinearSum
   * Z[0] = c[0] X[0][0] + c[1] X[1][0]
   */

  /* fill vector data and scaling factor */
  N_VConst(HALF, X[0][0]);
  N_VConst(NEG_ONE, X[1][0]);

  c[0] = TWO;
  c[1] = NEG_ONE;

  N_VConst(ZERO, Z[0]);

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(1, 2, c, X, Z);
  sync_device(V);
  stop_time = get_time();

  /* X[0][0] should equal +2 */
  if (ierr == 0) { failure = check_ans(TWO, Z[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 2b, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 2b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 3a: (nvec = 1, nsum > 2), N_VLinearCombination
   * X[0][0] = c[0] X[0][0] + c[1] X[1][0] + c[2] X[2][0]
   */

  /* fill vector data */
  N_VConst(ONE, X[0][0]);
  N_VConst(NEG_TWO, X[1][0]);
  N_VConst(NEG_ONE, X[2][0]);

  /* set scaling factors */
  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(1, 3, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][0] should equal +2 */
  if (ierr == 0) { failure = check_ans(TWO, X[0][0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 3a, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 3a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 3b: (nvec = 1, nsum > 2), N_VLinearCombination
   * Z[0] = c[0] X[0][0] + c[1] X[1][0] + c[2] X[2][0]
   */

  /* fill vector data */
  N_VConst(ONE, X[0][0]);
  N_VConst(NEG_TWO, X[1][0]);
  N_VConst(NEG_ONE, X[2][0]);

  /* set scaling factors */
  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(1, 3, c, X, Z);
  sync_device(V);
  stop_time = get_time();

  /* Z[0] should equal +2 */
  if (ierr == 0) { failure = check_ans(TWO, Z[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 3b, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 3b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 4a: (nvec > 1, nsum = 1), N_VScaleVectorArray
   * X[0][i] = c[0] X[0][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(NEG_TWO, X[0][0]);
  N_VConst(NEG_ONE, X[0][1]);
  N_VConst(TWO, X[0][2]);

  c[0] = HALF;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 1, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][i] should equal to -1, -1/2, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, X[0][0], local_length);
    failure += check_ans(NEG_HALF, X[0][1], local_length);
    failure += check_ans(ONE, X[0][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 4a, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 4a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 4b: (nvec > 1, nsum = 1), N_VScaleVectorArray
   * Z[i] = c[0] X[0][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(NEG_TWO, X[0][0]);
  N_VConst(NEG_ONE, X[0][1]);
  N_VConst(TWO, X[0][2]);

  c[0] = HALF;

  N_VConst(ZERO, Z[0]);
  N_VConst(ZERO, Z[1]);
  N_VConst(ZERO, Z[2]);

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 1, c, X, Z);
  sync_device(V);
  stop_time = get_time();

  /* X[0][i] should equal to -1, -1/2, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Z[0], local_length);
    failure += check_ans(NEG_HALF, Z[1], local_length);
    failure += check_ans(ONE, Z[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 4b, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 4b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 5a: (nvec > 1, nsum = 2), N_VLinearSumVectorArray
   * X[0][i] = c[0] X[0][i] + c[1] X[1][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(NEG_TWO, X[0][0]);
  N_VConst(TWO, X[1][0]);

  N_VConst(TWO, X[0][1]);
  N_VConst(HALF, X[1][1]);

  N_VConst(ZERO, X[0][2]);
  N_VConst(HALF, X[1][2]);

  c[0] = HALF;
  c[1] = TWO;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 2, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][i] should equal to +3, +2, +1 */
  if (ierr == 0)
  {
    failure = check_ans(ONE + TWO, X[0][0], local_length);
    failure += check_ans(TWO, X[0][1], local_length);
    failure += check_ans(ONE, X[0][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 5a, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 5a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 5b: (nvec > 1, nsum = 2), N_VLinearSumVectorArray
   * Z[0] = c[0] X[0][i] + c[1] X[1][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(NEG_TWO, X[0][0]);
  N_VConst(TWO, X[1][0]);

  N_VConst(TWO, X[0][1]);
  N_VConst(HALF, X[1][1]);

  N_VConst(ZERO, X[0][2]);
  N_VConst(HALF, X[1][2]);

  c[0] = HALF;
  c[1] = TWO;

  N_VConst(ZERO, Z[0]);
  N_VConst(ZERO, Z[1]);
  N_VConst(ZERO, Z[2]);

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 2, c, X, Z);
  sync_device(V);
  stop_time = get_time();

  /* X[0][i] should equal to +3, +2, +1 */
  if (ierr == 0)
  {
    failure = check_ans(ONE + TWO, Z[0], local_length);
    failure += check_ans(TWO, Z[1], local_length);
    failure += check_ans(ONE, Z[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 5b, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 5b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 6a: (nvec > 1, nsum > 2)
   * X[0][i] += c[1] X[1][i] + c[2] X[2][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(TWO, X[0][0]);
  N_VConst(NEG_TWO, X[1][0]);
  N_VConst(NEG_ONE, X[2][0]);

  N_VConst(ONE, X[0][1]);
  N_VConst(TWO, X[1][1]);
  N_VConst(ONE, X[2][1]);

  N_VConst(NEG_ONE, X[0][2]);
  N_VConst(TWO, X[1][2]);
  N_VConst(TWO, X[2][2]);

  c[0] = ONE;
  c[1] = NEG_HALF;
  c[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 3, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][i] should equal to +4, -1, -4 */
  if (ierr == 0)
  {
    failure = check_ans(TWO + TWO, X[0][0], local_length);
    failure += check_ans(NEG_ONE, X[0][1], local_length);
    failure += check_ans(-TWO - TWO, X[0][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 6a, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 6a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 6b: (nvec > 1, nsum > 2)
   * X[0][i] = c[0] X[0][i] + c[1] X[1][i] + c[2] X[2][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(ONE, X[0][0]);
  N_VConst(NEG_TWO, X[1][0]);
  N_VConst(NEG_ONE, X[2][0]);

  N_VConst(NEG_ONE, X[0][1]);
  N_VConst(TWO, X[1][1]);
  N_VConst(ONE, X[2][1]);

  N_VConst(HALF, X[0][2]);
  N_VConst(TWO, X[1][2]);
  N_VConst(ONE, X[2][2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 3, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][i] should equal to +2, -2, +1 */
  if (ierr == 0)
  {
    failure = check_ans(TWO, X[0][0], local_length);
    failure += check_ans(NEG_TWO, X[0][1], local_length);
    failure += check_ans(ONE, X[0][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 6b, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 6b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 6c: (nvec > 1, nsum > 2)
   * Z[i] = c[0] X[0][i] + c[1] X[1][i] + c[2] X[2][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(ONE, X[0][0]);
  N_VConst(NEG_TWO, X[1][0]);
  N_VConst(NEG_ONE, X[2][0]);

  N_VConst(NEG_ONE, X[0][1]);
  N_VConst(TWO, X[1][1]);
  N_VConst(ONE, X[2][1]);

  N_VConst(HALF, X[0][2]);
  N_VConst(TWO, X[1][2]);
  N_VConst(ONE, X[2][2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_ONE;

  N_VConst(ZERO, Z[0]);
  N_VConst(ZERO, Z[1]);
  N_VConst(ZERO, Z[2]);

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 3, c, X, Z);
  sync_device(V);
  stop_time = get_time();

  /* Z[i] should equal to +2, -2, +1 */
  if (ierr == 0)
  {
    failure = check_ans(TWO, Z[0], local_length);
    failure += check_ans(NEG_TWO, Z[1], local_length);
    failure += check_ans(ONE, Z[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 6c, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 6c \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Z, 3);
  N_VDestroyVectorArray(X[0], 3);
  N_VDestroyVectorArray(X[1], 3);
  N_VDestroyVectorArray(X[2], 3);

  return (fails);
}